

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O3

void anon_unknown.dwarf_f1f0ab::clipLine<((anonymous_namespace)::Edge)2>
               (QPointF *a,QPointF *b,qreal t,QPainterPath *result)

{
  double dVar1;
  double dVar2;
  long in_FS_OFFSET;
  double dVar3;
  QLineF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = a->xp;
  dVar2 = b->xp;
  if ((t < dVar1) && (t < dVar2)) goto LAB_003f0d94;
  if (t < dVar1) {
    dVar3 = (t - dVar1) / (dVar2 - dVar1);
    local_28.pt1.xp = dVar3 * (dVar2 - dVar1) + dVar1;
    local_28.pt1.yp = dVar3 * (b->yp - a->yp) + a->yp;
LAB_003f0d4b:
    local_28.pt2.xp = b->xp;
    local_28.pt2.yp = b->yp;
  }
  else {
    if (dVar2 <= t) {
      local_28.pt1.xp = a->xp;
      local_28.pt1.yp = a->yp;
      goto LAB_003f0d4b;
    }
    local_28.pt1.xp = a->xp;
    local_28.pt1.yp = a->yp;
    dVar3 = (t - dVar1) / (dVar2 - dVar1);
    local_28.pt2.xp = dVar3 * (dVar2 - dVar1) + dVar1;
    local_28.pt2.yp = dVar3 * (b->yp - a->yp) + a->yp;
  }
  addLine(result,&local_28);
LAB_003f0d94:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clipLine(const QPointF &a, const QPointF &b, qreal t, QPainterPath &result)
{
    bool outA = compare<edge>(a, t);
    bool outB = compare<edge>(b, t);
    if (outA && outB)
        return;

    if (outA)
        addLine(result, QLineF(intersectLine<edge>(a, b, t), b));
    else if (outB)
        addLine(result, QLineF(a, intersectLine<edge>(a, b, t)));
    else
        addLine(result, QLineF(a, b));
}